

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O2

bool __thiscall
crnlib::
hash_map<crnlib::vec<2U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<2U,_float>_>,_crnlib::equal_to<crnlib::vec<2U,_float>_>_>
::insert_no_grow(hash_map<crnlib::vec<2U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<2U,_float>_>,_crnlib::equal_to<crnlib::vec<2U,_float>_>_>
                 *this,insert_result *result,vec<2U,_float> *k,uint *v)

{
  float fVar1;
  raw_node *prVar2;
  uint uVar3;
  uint uVar4;
  raw_node *prVar5;
  uint uVar6;
  bool bVar7;
  float fVar8;
  
  if ((this->m_values).m_size == 0) {
    return false;
  }
  uVar3 = hash_key(this,k);
  prVar2 = (this->m_values).m_p;
  prVar5 = prVar2 + uVar3;
  uVar4 = uVar3;
  if (prVar2[uVar3].m_bits[0xc] == '\0') {
LAB_0016b135:
    if (this->m_grow_threshold <= this->m_num_valid) {
      return false;
    }
    *(undefined8 *)prVar5->m_bits = *(undefined8 *)k->m_s;
    *(uint *)(prVar5->m_bits + 8) = *v;
    prVar5->m_bits[0xc] = '\x01';
    this->m_num_valid = this->m_num_valid + 1;
    bVar7 = true;
    uVar3 = uVar4;
  }
  else {
    fVar1 = k->m_s[0];
    if ((*(float *)prVar5->m_bits != fVar1) || (NAN(*(float *)prVar5->m_bits) || NAN(fVar1))) {
      fVar8 = k->m_s[1];
    }
    else {
      fVar8 = k->m_s[1];
      if ((*(float *)(prVar5->m_bits + 4) == fVar8) &&
         (!NAN(*(float *)(prVar5->m_bits + 4)) && !NAN(fVar8))) {
        bVar7 = false;
        goto LAB_0016b15e;
      }
    }
    uVar6 = (this->m_values).m_size - 1;
    do {
      bVar7 = uVar4 == 0;
      prVar5 = prVar5 + -1;
      uVar4 = uVar4 - 1;
      if (bVar7) {
        prVar5 = prVar2 + uVar6;
        uVar4 = uVar6;
      }
      if (uVar3 == uVar4) {
        return false;
      }
      if (prVar5->m_bits[0xc] == '\0') goto LAB_0016b135;
    } while ((((*(float *)prVar5->m_bits != fVar1) || (NAN(*(float *)prVar5->m_bits) || NAN(fVar1)))
             || (*(float *)(prVar5->m_bits + 4) != fVar8)) ||
            (NAN(*(float *)(prVar5->m_bits + 4)) || NAN(fVar8)));
    bVar7 = false;
    uVar3 = uVar4;
  }
LAB_0016b15e:
  (result->first).m_pTable = this;
  (result->first).m_index = uVar3;
  result->second = bVar7;
  return true;
}

Assistant:

inline bool insert_no_grow(insert_result& result, const Key& k, const Value& v = Value())
        {
            if (!m_values.size())
            {
                return false;
            }

            int index = hash_key(k);
            node* pNode = &get_node(index);

            if (pNode->state)
            {
                if (m_equals(pNode->first, k))
                {
                    result.first = iterator(*this, index);
                    result.second = false;
                    return true;
                }

                const int orig_index = index;

                for (;;)
                {
                    if (!index)
                    {
                        index = m_values.size() - 1;
                        pNode = &get_node(index);
                    }
                    else
                    {
                        index--;
                        pNode--;
                    }

                    if (orig_index == index)
                    {
                        return false;
                    }

                    if (!pNode->state)
                    {
                        break;
                    }

                    if (m_equals(pNode->first, k))
                    {
                        result.first = iterator(*this, index);
                        result.second = false;
                        return true;
                    }
                }
            }

            if (m_num_valid >= m_grow_threshold)
            {
                return false;
            }

            construct_value_type(pNode, k, v);

            pNode->state = cStateValid;

            m_num_valid++;
            CRNLIB_ASSERT(m_num_valid <= m_values.size());

            result.first = iterator(*this, index);
            result.second = true;

            return true;
        }